

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O1

void async_connect_handler_fail(error_code *e)

{
  ostream *poVar1;
  runtime_error *this;
  ostringstream oss;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  booster::aio::io_service::stop();
  if (e->_M_value != 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
             ,0x6d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x159);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," e",2);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1b0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void async_connect_handler_fail(booster::system::error_code const &e)
{
    the_service->stop();
    TEST(e);
}